

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd.cpp
# Opt level: O2

void __thiscall NshCmdCopy_Success_Test::~NshCmdCopy_Success_Test(NshCmdCopy_Success_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NshCmdCopy, Success)
{
    nsh_cmd_t cmd_from;
    ASSERT_EQ(nsh_cmd_init(&cmd_from, cmd_test_name, &cmd_test_handler), NSH_STATUS_OK);

    nsh_cmd_t cmd_to;
    ASSERT_EQ(nsh_cmd_init_empty(&cmd_to), NSH_STATUS_OK);

    ASSERT_STRNE(cmd_to.name, cmd_from.name);
    ASSERT_NE(cmd_to.handler, cmd_from.handler);

    nsh_cmd_copy(&cmd_to, &cmd_from);

    ASSERT_STREQ(cmd_to.name, cmd_from.name);
    ASSERT_EQ(cmd_to.handler, cmd_from.handler);
}